

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcol.c
# Opt level: O0

int fits_iter_set_by_name(iteratorCol *col,fitsfile *fptr,char *colname,int datatype,int iotype)

{
  int iotype_local;
  int datatype_local;
  char *colname_local;
  fitsfile *fptr_local;
  iteratorCol *col_local;
  
  col->fptr = fptr;
  strncpy(col->colname,colname,0x45);
  col->colname[0x45] = '\0';
  col->colnum = 0;
  col->datatype = datatype;
  col->iotype = iotype;
  return 0;
}

Assistant:

int fits_iter_set_by_name(iteratorCol *col, /* I - iterator col structure */
           fitsfile *fptr,  /* I - FITS file pointer                      */
           char *colname,   /* I - column name                            */
           int datatype,    /* I - column datatype                        */
           int iotype)      /* I - InputCol, InputOutputCol, or OutputCol */
/*
  set all the parameters for an iterator column, by column name
*/
{
    col->fptr = fptr;
    strncpy(col->colname, colname,69);
    col->colname[69]=0;
    col->colnum = 0;  /* set column number undefined since name is given */
    col->datatype = datatype;
    col->iotype = iotype;
    return(0);
}